

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.h
# Opt level: O2

int __thiscall imrt::Station::getMaxIntensityRow(Station *this,int i)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = (this->I).cols_;
  uVar5 = 0;
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = uVar5;
  }
  iVar3 = -1;
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    dVar1 = (this->I).p[i][uVar5];
    if ((double)iVar3 < dVar1) {
      iVar3 = (int)dVar1;
    }
  }
  return iVar3;
}

Assistant:

int getMaxIntensityRow(int i) const{
    int max=-1;
    for(int j=0;j<I.nb_cols();j++){
      if(I(i,j)>max)
        max=I(i,j);
    }
    return max;
  }